

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O2

Span<const_int> __thiscall
bssl::Span<const_int>::subspan(Span<const_int> *this,size_t pos,size_t len)

{
  ulong uVar1;
  Span<const_int> SVar2;
  
  uVar1 = this->size_ - pos;
  if (pos <= this->size_) {
    if (uVar1 < len) {
      len = uVar1;
    }
    SVar2.size_ = len;
    SVar2.data_ = this->data_ + pos;
    return SVar2;
  }
  abort();
}

Assistant:

constexpr Span subspan(size_t pos = 0, size_t len = npos) const {
    if (pos > size_) {
      // absl::Span throws an exception here. Note std::span and Chromium
      // base::span additionally forbid pos + len being out of range, with a
      // special case at npos/dynamic_extent, while absl::Span::subspan clips
      // the span. For now, we align with absl::Span in case we switch to it in
      // the future.
      abort();
    }
    return Span(data_ + pos, std::min(size_ - pos, len));
  }